

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O0

HRESULT __thiscall
ChakraCoreHostScriptContext::NotifyHostAboutModuleReady
          (ChakraCoreHostScriptContext *this,ModuleRecordBase *referencingModule,Var exceptionVar)

{
  JsErrorCode JVar1;
  AutoFilterExceptionRegion local_2c;
  JsErrorCode errorCode;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  Var exceptionVar_local;
  ModuleRecordBase *referencingModule_local;
  ChakraCoreHostScriptContext *this_local;
  
  if (this->notifyModuleReadyCallback == (NotifyModuleReadyCallback)0x0) {
    this_local._4_4_ = -0x7ff8ffa9;
  }
  else {
    _errorCode = exceptionVar;
    AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_2c,ExceptionType_All);
    JVar1 = (*this->notifyModuleReadyCallback)(referencingModule,_errorCode);
    if (JVar1 == JsNoError) {
      this_local._4_4_ = 0;
    }
    AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_2c);
    if (JVar1 != JsNoError) {
      this_local._4_4_ = -0x7ff8ffa9;
    }
  }
  return this_local._4_4_;
}

Assistant:

HRESULT ChakraCoreHostScriptContext::NotifyHostAboutModuleReady(Js::ModuleRecordBase* referencingModule, Js::Var exceptionVar)
{
    if (notifyModuleReadyCallback == nullptr)
    {
        return E_INVALIDARG;
    }
    {
        AUTO_NO_EXCEPTION_REGION;
        JsErrorCode errorCode = notifyModuleReadyCallback(referencingModule, exceptionVar);
        if (errorCode == JsNoError)
        {
            return NOERROR;
        }
    }
    return E_INVALIDARG;
}